

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::Append
          (ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *this,ON_SubDLimitMeshSealEdgeInfo *x)

{
  ON_SubDMeshFragment *pOVar1;
  uchar uVar2;
  uchar uVar3;
  unsigned_short uVar4;
  int iVar5;
  ON_SubDLimitMeshSealEdgeInfo *pOVar6;
  ON_SubDLimitMeshSealEdgeInfo *pOVar7;
  
  iVar5 = this->m_count;
  pOVar6 = x;
  if (iVar5 == this->m_capacity) {
    iVar5 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar6 = (ON_SubDLimitMeshSealEdgeInfo *)onmalloc(0x10);
      uVar2 = x->m_bits;
      uVar3 = x->m_grid_side_dex;
      uVar4 = x->m_face_edge_count;
      pOVar1 = x->m_fragment;
      pOVar6->m_edge_id = x->m_edge_id;
      pOVar6->m_bits = uVar2;
      pOVar6->m_grid_side_dex = uVar3;
      pOVar6->m_face_edge_count = uVar4;
      pOVar6->m_fragment = pOVar1;
    }
    Reserve(this,(long)iVar5);
    pOVar7 = this->m_a;
    if (pOVar7 == (ON_SubDLimitMeshSealEdgeInfo *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar5 = this->m_count;
  }
  else {
    pOVar7 = this->m_a;
  }
  this->m_count = iVar5 + 1;
  uVar2 = pOVar6->m_bits;
  uVar3 = pOVar6->m_grid_side_dex;
  uVar4 = pOVar6->m_face_edge_count;
  pOVar1 = pOVar6->m_fragment;
  pOVar7 = pOVar7 + iVar5;
  pOVar7->m_edge_id = pOVar6->m_edge_id;
  pOVar7->m_bits = uVar2;
  pOVar7->m_grid_side_dex = uVar3;
  pOVar7->m_face_edge_count = uVar4;
  pOVar7->m_fragment = pOVar1;
  if (pOVar6 != x) {
    onfree(pOVar6);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}